

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_free.c
# Opt level: O3

void lyd_free_(lyd_node *node)

{
  lysc_node *plVar1;
  lyd_node *plVar2;
  lyd_node *node_00;
  lyd_node *first_sibling;
  lyd_node *local_20;
  
  local_20 = (lyd_node *)0x0;
  if ((node != (lyd_node *)0x0) && (node_00 = lyd_first_sibling(node), node_00 != (lyd_node *)0x0))
  {
    do {
      plVar1 = node_00->schema;
      plVar2 = node_00->next;
      if ((((plVar1 != (lysc_node *)0x0) && (plVar1->nodetype == 4)) &&
          ((plVar1->flags & 0x100) != 0)) && (node_00->parent != (lyd_node_inner *)0x0)) {
        ly_log(plVar1->module->ctx,LY_LLERR,LY_EINVAL,
               "Cannot free a list key \"%s\", free the list instance instead.",plVar1->name);
        return;
      }
      if (node_00->parent != (lyd_node_inner *)0x0) {
        lyds_free_metadata(node_00);
        lyd_unlink_ignore_lyds(&local_20,node_00);
      }
      lyd_free_subtree(node_00);
      node_00 = plVar2;
    } while (plVar2 != (lyd_node *)0x0);
  }
  return;
}

Assistant:

static void
lyd_free_(struct lyd_node *node)
{
    struct lyd_node *iter, *next, *first_sibling = NULL;

    if (!node) {
        return;
    }

    LY_LIST_FOR_SAFE(lyd_first_sibling(node), next, iter) {
        if (lysc_is_key(iter->schema) && iter->parent) {
            LOGERR(LYD_CTX(iter), LY_EINVAL, "Cannot free a list key \"%s\", free the list instance instead.", LYD_NAME(iter));
            return;
        }

        /* in case of the top-level nodes (node->parent is NULL), no unlinking needed */
        if (iter->parent) {
            lyds_free_metadata(iter);
            lyd_unlink_ignore_lyds(&first_sibling, iter);
        }
        lyd_free_subtree(iter);
    }
}